

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptFunction::GetDiagValueString
          (JavascriptFunction *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  byte bVar1;
  Type TVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  int propertyId;
  charcount_t cVar7;
  uint extraout_var;
  undefined4 *puVar8;
  PropertyString *name;
  JavascriptString *this_00;
  FunctionProxy *this_01;
  ParseableFunctionInfo *this_02;
  int *piVar9;
  size_t sVar10;
  char16 *pcVar11;
  Type TVar12;
  byte bVar13;
  Type countNeeded;
  charcount_t local_44;
  LPCUTF8 puStack_40;
  charcount_t displayNameLength;
  LPCUTF8 pbStart;
  RecyclableObject *obj;
  
  propertyId = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])();
  obj = (RecyclableObject *)CONCAT44(extraout_var,propertyId);
  if (obj == (RecyclableObject *)0x0) {
    this_01 = GetFunctionProxy(this);
    if (this_01 == (FunctionProxy *)0x0) {
      this_00 = StringCache::GetFunctionDisplay
                          (&((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                             javascriptLibrary).ptr)->stringCache);
      bVar13 = 1;
    }
    else {
      this_02 = FunctionProxy::EnsureDeserialized(this_01);
      bVar1 = ((this_02->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8;
      bVar6 = bVar1 & 4;
      bVar13 = bVar6 >> 2;
      if (bVar6 == 0) {
        countNeeded = this_02->m_cchLength;
        pbStart = (LPCUTF8)stringBuilder;
        puStack_40 = ParseableFunctionInfo::GetToStringSource
                               (this_02,L"JavascriptFunction::GetDiagValueString");
        TVar2 = this_02->m_cbLength;
        piVar9 = (int *)FunctionProxy::GetAuxPtr(&this_02->super_FunctionProxy,PrintOffsets);
        stringBuilder = (StringBuilder<Memory::ArenaAllocator> *)pbStart;
        TVar12 = TVar2;
        if (piVar9 != (int *)0x0) {
          TVar12 = piVar9[1] - *piVar9;
          countNeeded = countNeeded + (TVar12 - TVar2) * 3;
        }
        StringBuilder<Memory::ArenaAllocator>::EnsureBuffer
                  ((StringBuilder<Memory::ArenaAllocator> *)pbStart,countNeeded);
        sVar10 = utf8::DecodeUnitsInto
                           (*(char16 **)((long)stringBuilder + 0x20),&stack0xffffffffffffffc0,
                            puStack_40 + TVar12,bVar1 >> 1 & doAllowThreeByteSurrogates,(bool *)0x0)
        ;
        if (0x7ffffffd < sVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                      ,0xc61,"(decodedCount < MaxCharCount)",
                                      "decodedCount < MaxCharCount");
          if (!bVar5) goto LAB_00bd9b88;
          *puVar8 = 0;
        }
        cVar7 = 0x100;
        if ((uint)sVar10 < 0x100) {
          cVar7 = (uint)sVar10;
        }
        StringBuilder<Memory::ArenaAllocator>::IncreaseCount(stringBuilder,cVar7);
        this_00 = (JavascriptString *)0x0;
      }
      else {
        local_44 = 0;
        pSVar3 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary
                   ).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
        pcVar11 = FunctionProxy::GetShortDisplayName(&this_02->super_FunctionProxy,&local_44);
        this_00 = GetLibraryCodeDisplayStringCommon<Js::JavascriptString,Js::JavascriptString*,Js::ScriptContext>
                            (pSVar3,pcVar11);
      }
    }
    if (bVar13 == 0) {
      return 1;
    }
  }
  else {
    pbStart = (LPCUTF8)stringBuilder;
    if ((extraout_var & 0x1ffff) != 0x10000 && (extraout_var & 0xffff0000) == 0x10000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00bd9b88;
      *puVar8 = 0;
    }
    stringBuilder = (StringBuilder<Memory::ArenaAllocator> *)pbStart;
    if ((extraout_var & 0xffff0000) == 0x10000) {
      pSVar3 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if ((extraout_var & 0x1ffff) != 0x10000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar5) goto LAB_00bd9b88;
        *puVar8 = 0;
      }
      name = ScriptContext::GetPropertyString(pSVar3,propertyId);
      this_00 = GetNativeFunctionDisplayStringCommon<Js::JavascriptString,Js::JavascriptString*,Js::ScriptContext>
                          (pSVar3,&name->super_JavascriptString);
    }
    else {
      if (((RecyclableObject *)0xffffffffffff < obj) ||
         (bVar5 = VarIsImpl<Js::JavascriptString>(obj), !bVar5)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                    ,0xc73,"(VarIs<JavascriptString>(sourceString))",
                                    "VarIs<JavascriptString>(sourceString)");
        if (!bVar5) goto LAB_00bd9b88;
        *puVar8 = 0;
      }
      this_00 = VarTo<Js::JavascriptString>(obj);
    }
  }
  if (this_00 == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xc78,"(pString)","pString");
    if (!bVar5) {
LAB_00bd9b88:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  pcVar11 = JavascriptString::GetString(this_00);
  cVar7 = JavascriptString::GetLength(this_00);
  StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,cVar7);
  JavascriptString::CopyHelper(stringBuilder->appendPtr,pcVar11,cVar7);
  stringBuilder->appendPtr = stringBuilder->appendPtr + cVar7;
  stringBuilder->count = stringBuilder->count + cVar7;
  return 1;
}

Assistant:

BOOL JavascriptFunction::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        JavascriptString * pString = NULL;

        Var sourceString = this->GetSourceString();

        if (sourceString == nullptr)
        {
            FunctionProxy* proxy = this->GetFunctionProxy();
            if (proxy)
            {
                ParseableFunctionInfo * func = proxy->EnsureDeserialized();
                Utf8SourceInfo* sourceInfo = func->GetUtf8SourceInfo();
                if (sourceInfo->GetIsLibraryCode())
                {
                    charcount_t displayNameLength = 0;
                    pString = JavascriptFunction::GetLibraryCodeDisplayString(this->GetScriptContext(), func->GetShortDisplayName(&displayNameLength));
                }
                else
                {
                    utf8::DecodeOptions options = sourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
                    charcount_t count = func->LengthInChars();
                    LPCUTF8 pbStart = func->GetToStringSource(_u("JavascriptFunction::GetDiagValueString"));
                    size_t cbLength = func->LengthInBytes();
                    PrintOffsets* printOffsets = func->GetPrintOffsets();
                    if (printOffsets != nullptr)
                    {
                        count += 3*(charcount_t)((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) - cbLength);
                        cbLength = printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset;
                    }

                    size_t decodedCount = utf8::DecodeUnitsInto(stringBuilder->AllocBufferSpace(count), pbStart, pbStart + cbLength, options);
                    Assert(decodedCount < MaxCharCount);
                    stringBuilder->IncreaseCount(min(DIAG_MAX_FUNCTION_STRING, (charcount_t)decodedCount));
                    return TRUE;
                }
            }
            else
            {
                pString = GetLibrary()->GetFunctionDisplayString();
            }
        }
        else
        {
            if (TaggedInt::Is(sourceString))
            {
                pString = GetNativeFunctionDisplayString(this->GetScriptContext(), this->GetScriptContext()->GetPropertyString(TaggedInt::ToInt32(sourceString)));
            }
            else
            {
                Assert(VarIs<JavascriptString>(sourceString));
                pString = VarTo<JavascriptString>(sourceString);
            }
        }

        Assert(pString);
        stringBuilder->Append(pString->GetString(), pString->GetLength());

        return TRUE;
    }